

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O1

Aig_RMan_t * Aig_RManStart(void)

{
  uint uVar1;
  uint uVar2;
  Aig_RMan_t *__s;
  Aig_Man_t *p;
  Aig_Tru_t **ppAVar3;
  Aig_MmFlex_t *pAVar4;
  Bdc_Man_t *pBVar5;
  uint uVar6;
  int iVar7;
  
  __s = (Aig_RMan_t *)malloc(0xd78);
  memset(__s,0,0xd78);
  __s->nVars = 0xc;
  p = Aig_ManStart(1000000);
  __s->pAig = p;
  Aig_IthVar(p,0xb);
  uVar6 = 4999;
  while( true ) {
    do {
      uVar1 = uVar6 + 1;
      uVar2 = uVar6 & 1;
      uVar6 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar7 = 5;
    while (uVar1 % (iVar7 - 2U) != 0) {
      uVar2 = iVar7 * iVar7;
      iVar7 = iVar7 + 2;
      if (uVar1 < uVar2) goto LAB_006ac63f;
    }
  }
LAB_006ac63f:
  __s->nBins = uVar1;
  ppAVar3 = (Aig_Tru_t **)calloc((long)(int)uVar1,8);
  __s->pBins = ppAVar3;
  pAVar4 = Aig_MmFlexStart();
  __s->pMemTrus = pAVar4;
  Aig_RManStart::Pars.nVarsMax = 0xc;
  Aig_RManStart::Pars.fVerbose = 0;
  pBVar5 = Bdc_ManAlloc(&Aig_RManStart::Pars);
  __s->pBidec = pBVar5;
  return __s;
}

Assistant:

Aig_RMan_t * Aig_RManStart()
{
    static Bdc_Par_t Pars = {0}, * pPars = &Pars;
    Aig_RMan_t * p;
    p = ABC_ALLOC( Aig_RMan_t, 1 );
    memset( p, 0, sizeof(Aig_RMan_t) );
    p->nVars = RMAN_MAXVARS;
    p->pAig  = Aig_ManStart( 1000000 );
    Aig_IthVar( p->pAig, p->nVars-1 );
    // create hash table
    p->nBins = Abc_PrimeCudd(5000);
    p->pBins = ABC_CALLOC( Aig_Tru_t *, p->nBins );
    p->pMemTrus = Aig_MmFlexStart();
    // bi-decomposition manager
    pPars->nVarsMax = p->nVars;
    pPars->fVerbose = 0;
    p->pBidec = Bdc_ManAlloc( pPars );
    return p;
}